

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

thread_pool * new_thread_pool(size_t thread_count)

{
  cnd_t *pcVar1;
  cnd_t *pcVar2;
  mtx_t *pmVar3;
  long *plVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  int iVar8;
  thread_pool *__ptr;
  thread_data *ptVar9;
  thrd_t *ptVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  bool bVar16;
  
  if (thread_count == 0) {
    __assert_fail("thread_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                  ,0x8a,"struct thread_pool *new_thread_pool(size_t)");
  }
  plVar12 = (long *)0xd8;
  __ptr = (thread_pool *)malloc(0xd8);
  if (__ptr == (thread_pool *)0x0) {
    new_thread_pool_cold_3();
    lVar11 = *plVar12;
    plVar5 = (long *)plVar12[1];
    lVar13 = plVar12[2];
    plVar12 = plVar5 + 0x12;
    do {
      mtx_lock(plVar12);
      while (puVar6 = (undefined8 *)*plVar5, puVar6 == (undefined8 *)0x0) {
        if ((*(char *)(lVar11 + 0x10) != '\0') || (iVar8 = cnd_wait(plVar5 + 6,plVar12), iVar8 != 0)
           ) {
          mtx_unlock(plVar12);
          return (thread_pool *)0x0;
        }
      }
      lVar7 = puVar6[1];
      *plVar5 = lVar7;
      if (lVar7 == 0) {
        if ((undefined8 *)plVar5[1] != puVar6) {
          __assert_fail("queue->last_item == item",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                        ,0x4f,"int thread_pool_worker(void *)");
        }
        plVar5[1] = 0;
      }
      plVar5[5] = plVar5[5] + 1;
      mtx_unlock(plVar12);
      (*(code *)*puVar6)(puVar6,lVar13);
      mtx_lock(plVar12);
      puVar6[1] = plVar5[2];
      plVar5[2] = (long)puVar6;
      lVar7 = plVar5[3];
      plVar4 = plVar5 + 5;
      *plVar4 = *plVar4 + -1;
      plVar5[3] = lVar7 + 1U;
      if (((*plVar4 == 0) && (*plVar5 == 0)) || (plVar5[4] - 1U < lVar7 + 1U)) {
        cnd_signal(plVar5 + 0xc);
      }
      mtx_unlock(plVar12);
    } while( true );
  }
  pcVar1 = &(__ptr->queue).avail_cond;
  iVar8 = cnd_init(pcVar1);
  if (iVar8 != 0) goto LAB_00101542;
  pcVar2 = &(__ptr->queue).done_cond;
  iVar8 = cnd_init(pcVar2);
  if (iVar8 == 0) {
    pmVar3 = &(__ptr->queue).mutex;
    iVar8 = mtx_init(pmVar3,0);
    if (iVar8 == 0) {
      (__ptr->queue).done_target = 0;
      (__ptr->queue).worked_on = 0;
      (__ptr->queue).done_items = (work_item *)0x0;
      (__ptr->queue).done_count = 0;
      (__ptr->queue).first_item = (work_item *)0x0;
      (__ptr->queue).last_item = (work_item *)0x0;
      if (thread_count * 0x18 == 0) {
LAB_001015a4:
        ptVar9 = (thread_data *)0x0;
      }
      else {
        ptVar9 = (thread_data *)malloc(thread_count * 0x18);
        if (ptVar9 == (thread_data *)0x0) {
          new_thread_pool_cold_1();
          goto LAB_001015a4;
        }
      }
      __ptr->thread_data = ptVar9;
      if (thread_count * 8 == 0) {
LAB_001015cd:
        ptVar10 = (thrd_t *)0x0;
      }
      else {
        ptVar10 = (thrd_t *)malloc(thread_count * 8);
        if (ptVar10 == (thrd_t *)0x0) {
          new_thread_pool_cold_2();
          goto LAB_001015cd;
        }
      }
      __ptr->threads = ptVar10;
      __ptr->thread_count = thread_count;
      __ptr->should_stop = false;
      bVar16 = true;
      lVar11 = 0;
      lVar13 = 0;
      sVar14 = 0;
      while( true ) {
        ptVar9 = __ptr->thread_data;
        *(thread_pool **)((long)&ptVar9->thread_pool + lVar11) = __ptr;
        *(work_queue **)((long)&ptVar9->queue + lVar11) = &__ptr->queue;
        *(size_t *)((long)&ptVar9->thread_id + lVar11) = sVar14;
        iVar8 = thrd_create((long)__ptr->threads + lVar13,thread_pool_worker,
                            (long)&ptVar9->thread_pool + lVar11);
        if (iVar8 != 0) break;
        sVar14 = sVar14 + 1;
        bVar16 = sVar14 < thread_count;
        lVar13 = lVar13 + 8;
        lVar11 = lVar11 + 0x18;
        if (thread_count + (thread_count == 0) == sVar14) {
          return __ptr;
        }
      }
      __ptr->thread_count = sVar14;
      if (!bVar16) {
        return __ptr;
      }
      mtx_lock(pmVar3);
      __ptr->should_stop = true;
      cnd_broadcast(pcVar1);
      mtx_unlock(pmVar3);
      sVar14 = __ptr->thread_count;
      if (sVar14 != 0) {
        sVar15 = 0;
        do {
          thrd_join(__ptr->threads[sVar15],0);
          sVar15 = sVar15 + 1;
        } while (sVar14 != sVar15);
      }
      mtx_destroy(pmVar3);
      cnd_destroy(pcVar1);
      cnd_destroy(pcVar2);
      free(__ptr->threads);
      free(__ptr->thread_data);
      goto LAB_00101542;
    }
    cnd_destroy(pcVar2);
  }
  cnd_destroy(pcVar1);
LAB_00101542:
  free(__ptr);
  return (thread_pool *)0x0;
}

Assistant:

struct thread_pool* new_thread_pool(size_t thread_count) {
    assert(thread_count > 0);
    struct thread_pool* thread_pool = xmalloc(sizeof(struct thread_pool));
    if (!init_work_queue(&thread_pool->queue))
        goto cleanup_queue;
    thread_pool->thread_data = xmalloc(sizeof(struct thread_data) * thread_count);
    thread_pool->threads = xmalloc(sizeof(thrd_t) * thread_count);
    thread_pool->thread_count = thread_count;
    thread_pool->should_stop = false;
    for (size_t i = 0; i < thread_count; ++i) {
        thread_pool->thread_data[i].thread_pool = thread_pool;
        thread_pool->thread_data[i].queue = &thread_pool->queue;
        thread_pool->thread_data[i].thread_id = i;
        if (thrd_create(thread_pool->threads + i, thread_pool_worker, &thread_pool->thread_data[i]) != thrd_success) {
            thread_pool->thread_count = i;
            goto cleanup_thread;
        }
    }
    return thread_pool;
cleanup_thread:
    terminate_threads(thread_pool);
    free_work_queue(&thread_pool->queue);
    free(thread_pool->threads);
    free(thread_pool->thread_data);
cleanup_queue:
    free(thread_pool);
    return NULL;
}